

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view str)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  char *in_R9;
  string_view input;
  string_view whitespace;
  
  input._M_len = str._M_len;
  input._M_str = (char *)0x8;
  whitespace._M_str = in_R9;
  whitespace._M_len = (size_t)&whiteChars;
  trim_abi_cxx11_(__return_storage_ptr__,this,input,whitespace);
  if (__return_storage_ptr__->_M_string_length != 0) {
    pbVar2 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    bVar1 = *pbVar2;
    uVar3 = bVar1 - 0x22;
    if (((uVar3 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) &&
       (pbVar2[__return_storage_ptr__->_M_string_length - 1] == bVar1)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,0,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string removeQuotes(std::string_view str)
    {
        auto newString = trim(str);
        if (!newString.empty()) {
            if ((newString.front() == '\"') || (newString.front() == '\'') ||
                (newString.front() == '`')) {
                if (newString.back() == newString.front()) {
                    newString.pop_back();
                    newString.erase(0, 1);
                }
            }
        }
        return newString;
    }